

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashing.cpp
# Opt level: O0

bool isValidChash160(char *chash)

{
  uchar uVar1;
  uchar uVar2;
  size_t sVar3;
  ostream *this;
  char *pcVar4;
  bool abStack_257 [195];
  int local_194;
  uint8_t local_190 [4];
  int i_3;
  uint8_t calculatedChecksum [4];
  int i_2;
  uint8_t hash160 [20];
  byte local_165;
  byte local_164;
  byte local_163;
  byte local_162;
  byte local_161;
  uchar i_1;
  uchar indexOffset;
  uchar j;
  uchar i;
  uchar value;
  char *pch;
  bool hash160Bin [128];
  bool checksumedHashBin [160];
  bool checksumBin [32];
  char *chash_local;
  
  sVar3 = strlen(chash);
  if (sVar3 == 0x20) {
    for (local_162 = 0; local_162 < 0x20; local_162 = local_162 + 1) {
      pcVar4 = strchr("ABCDEFGHIJKLMNOPQRSTUVWXYZ234567",(int)chash[local_162]);
      local_161 = (char)pcVar4 + 0xa0;
      for (local_163 = 5; local_163 != 0; local_163 = local_163 - 1) {
        hash160Bin[(long)(int)((uint)local_162 * 5 + (uint)local_163 + -1) + 0x78] =
             (local_161 & 1) != 0;
        local_161 = local_161 / 2;
      }
    }
    local_164 = 0;
    for (local_165 = 0; local_165 < 0xa0; local_165 = local_165 + 1) {
      if (local_165 == offsets[local_164]) {
        checksumedHashBin[(ulong)local_164 + 0x98] = (bool)(hash160Bin[(ulong)local_165 + 0x78] & 1)
        ;
        local_164 = local_164 + 1;
      }
      else {
        hash160Bin[(long)(int)((uint)local_165 - (uint)local_164) + -8] =
             (bool)(hash160Bin[(ulong)local_165 + 0x78] & 1);
      }
    }
    for (i_3 = 0; i_3 < 0x10; i_3 = i_3 + 1) {
      uVar1 = binArrayToByte(hash160Bin + (long)(i_3 << 3) + -8);
      calculatedChecksum[i_3 + 4] = uVar1;
    }
    getChecksum((char *)calculatedChecksum,local_190);
    for (local_194 = 0; local_194 < 4; local_194 = local_194 + 1) {
      uVar1 = local_190[local_194];
      uVar2 = binArrayToByte(checksumedHashBin + (long)(local_194 << 3) + 0x98);
      if (uVar1 != uVar2) {
        return false;
      }
    }
    chash_local._7_1_ = true;
  }
  else {
    this = std::operator<<((ostream *)&std::clog,"chash is not 32 length");
    std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
    chash_local._7_1_ = false;
  }
  return chash_local._7_1_;
}

Assistant:

bool isValidChash160(const char *chash) {

    if (strlen(chash) != 32) {
#ifdef DEBUG_PRINT
        std::clog << "chash is not 32 length" << std::endl;
#endif
        return false;
    }

    bool checksumBin[32];
    bool checksumedHashBin[160];
    bool hash160Bin[128];

    //convert base32 to bin
    char *pch;
    unsigned char value = 0;
    for (unsigned char i = 0; i < 32; i++) {
        pch = (char *) strchr(base32Chars, chash[i]);
        value = pch - base32Chars;
        for (unsigned char j = 5; j > 0; j--) {
            checksumedHashBin[i * 5 + j - 1] = value & 1;
            value /= 2;
        }
    }

    //unmix data
    unsigned char indexOffset = 0;
    for (unsigned char i = 0; i < 160; i++) {
        if (i == offsets[indexOffset]) {
            checksumBin[indexOffset] = checksumedHashBin[i];
            indexOffset++;

        } else {
            hash160Bin[i - indexOffset] = checksumedHashBin[i];
        }
    }

    uint8_t hash160[20];
    //convert bin to byte
    for (int i = 0; i < 16; i++) {
        hash160[i + 4] = binArrayToByte(&hash160Bin[i * 8]);
    }

    uint8_t calculatedChecksum[4];
    getChecksum((char *) hash160, calculatedChecksum);

    //compare checksums
    for (int i = 0; i < 4; i++) {
        if (calculatedChecksum[i] != binArrayToByte(&checksumBin[i * 8]))
            return false;
    }
    return true;
}